

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_text.cpp
# Opt level: O0

void __thiscall flatbuffers::JsonPrinter::OutputIdentifier(JsonPrinter *this,string *name)

{
  string *name_local;
  JsonPrinter *this_local;
  
  if ((this->opts->strict_json & 1U) != 0) {
    std::__cxx11::string::operator+=((string *)this->text,'\"');
  }
  std::__cxx11::string::operator+=((string *)this->text,(string *)name);
  if ((this->opts->strict_json & 1U) != 0) {
    std::__cxx11::string::operator+=((string *)this->text,'\"');
  }
  return;
}

Assistant:

void OutputIdentifier(const std::string &name) {
    if (opts.strict_json) text += '\"';
    text += name;
    if (opts.strict_json) text += '\"';
  }